

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O1

bool __thiscall IntBounds::SetIsNot(IntBounds *this,int constantValue,bool isExplicit)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (this->constantLowerBound != this->constantUpperBound) {
    if (this->constantUpperBound <= this->constantLowerBound) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                         ,0xf6,"(constantLowerBound < constantUpperBound)",
                         "constantLowerBound < constantUpperBound");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    if (this->constantLowerBound == constantValue) {
      this->constantLowerBound = this->constantLowerBound + 1;
      return true;
    }
    if (this->constantUpperBound == constantValue) {
      this->constantUpperBound = this->constantUpperBound + -1;
      if (!isExplicit) {
        return true;
      }
      this->wasConstantUpperBoundEstablishedExplicitly = true;
      return true;
    }
  }
  return false;
}

Assistant:

bool IntBounds::SetIsNot(const int constantValue, const bool isExplicit)
{
    if(constantLowerBound == constantUpperBound)
        return false;

    Assert(constantLowerBound < constantUpperBound);
    if(constantValue == constantLowerBound)
    {
        ++constantLowerBound;
        return true;
    }
    if(constantValue == constantUpperBound)
    {
        --constantUpperBound;
        if(isExplicit)
            wasConstantUpperBoundEstablishedExplicitly = true;
        return true;
    }
    return false;
}